

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

smf_track_t * smf_find_track_with_next_event(smf_t *smf)

{
  smf_track_t *psVar1;
  smf_track_t *local_28;
  smf_track_t *min_time_track;
  smf_track_t *track;
  int min_time;
  int i;
  smf_t *smf_local;
  
  track._0_4_ = 0;
  local_28 = (smf_track_t *)0x0;
  track._4_4_ = 1;
  while( true ) {
    if (smf->number_of_tracks < track._4_4_) {
      return local_28;
    }
    psVar1 = smf_get_track_by_number(smf,track._4_4_);
    if (psVar1 == (smf_track_t *)0x0) break;
    if ((psVar1->next_event_number != -1) &&
       ((psVar1->time_of_next_event < (int)track || (local_28 == (smf_track_t *)0x0)))) {
      track._0_4_ = psVar1->time_of_next_event;
      local_28 = psVar1;
    }
    track._4_4_ = track._4_4_ + 1;
  }
  __assert_fail("track",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0x32b,"smf_track_t *smf_find_track_with_next_event(smf_t *)");
}

Assistant:

smf_track_t *
smf_find_track_with_next_event(smf_t *smf)
{
	int i, min_time = 0;
	smf_track_t *track = NULL, *min_time_track = NULL;

	/* Find track with event that should be played next. */
	for (i = 1; i <= smf->number_of_tracks; i++) {
		track = smf_get_track_by_number(smf, i);

		assert(track);

		/* No more events in this track? */
		if (track->next_event_number == -1)
			continue;

		if (track->time_of_next_event < min_time || min_time_track == NULL) {
			min_time = track->time_of_next_event;
			min_time_track = track;
		}
	}

	return (min_time_track);
}